

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricProgrammableGetParamInfoExpPrologue
          (ZETParameterValidation *this,zet_metric_programmable_exp_handle_t hMetricProgrammable,
          uint32_t *pParameterCount,zet_metric_programmable_param_info_exp_t *pParameterInfo)

{
  zet_metric_programmable_param_info_exp_t *pParameterInfo_local;
  uint32_t *pParameterCount_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  ZETParameterValidation *this_local;
  
  if (hMetricProgrammable == (zet_metric_programmable_exp_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (pParameterCount == (uint32_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pParameterInfo == (zet_metric_programmable_param_info_exp_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricProgrammableGetParamInfoExpPrologue(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t* pParameterCount,                      ///< [in,out] count of the parameters to retrieve parameter info.
                                                        ///< if value pParameterCount is greater than count of parameters
                                                        ///< available, then pParameterCount will be updated with count of
                                                        ///< parameters available.
                                                        ///< The count of parameters available can be queried using ::zetMetricProgrammableGetPropertiesExp.
        zet_metric_programmable_param_info_exp_t* pParameterInfo///< [in,out][range(1, *pParameterCount)] array of parameter info.
                                                        ///< if parameterCount is less than the number of parameters available,
                                                        ///< then driver shall only retrieve that number of parameter info.
        )
    {
        if( nullptr == hMetricProgrammable )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pParameterCount )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pParameterInfo )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }